

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O1

CaseProd *
slang::ast::RandSeqProductionSymbol::createCaseProd(RsCaseSyntax *syntax,ASTContext *context)

{
  size_t sVar1;
  RsCaseItemSyntax *pRVar2;
  Expression *args;
  span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL> expressions_00;
  int iVar3;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CaseProd *pCVar5;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_01;
  pointer ppRVar6;
  pointer pPVar7;
  ulong uVar8;
  SyntaxNode **args_00;
  long lVar9;
  SmallVectorBase<const_slang::ast::Expression_*> *pSVar10;
  StandardRsCaseItemSyntax *sci;
  pointer ppRVar11;
  SmallVector<const_slang::ast::Expression_*,_5UL> bound;
  SmallVector<const_slang::ast::Expression_*,_5UL> group;
  SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL> expressions;
  SmallVector<slang::ast::RandSeqProductionSymbol::ProdItem,_8UL> prods;
  SmallVector<slang::ast::RandSeqProductionSymbol::CaseItem,_8UL> items;
  SmallVectorBase<const_slang::ast::Expression_*> *in_stack_fffffffffffffbd8;
  Compilation *this;
  _Storage<slang::ast::RandSeqProductionSymbol::ProdItem,_true> local_408;
  char local_3e8;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> local_3e0;
  undefined8 local_3d8;
  undefined8 local_3d0;
  SyntaxNode local_3c8;
  ExpressionSyntax *local_3a0;
  pointer ppEStack_398;
  SmallVectorBase<const_slang::ast::Expression_*> local_390 [2];
  ExpressionSyntax *local_350;
  pointer ppEStack_348;
  undefined8 local_340;
  ExpressionSyntax local_338;
  CaseItem local_310;
  SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem> local_2e0 [5];
  undefined1 local_1c8 [24];
  CaseItem aCStack_1b0 [8];
  
  local_350 = &local_338;
  ppEStack_348 = (pointer)0x0;
  local_340 = 5;
  local_2e0[0].data_ = (pointer)local_2e0[0].firstElement;
  local_2e0[0].len = 0;
  local_2e0[0].cap = 8;
  local_3e8 = '\0';
  sVar1 = (syntax->items).super_span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppRVar6 = (syntax->items).super_span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>.
              _M_ptr;
    pSVar10 = (SmallVectorBase<const_slang::ast::Expression_*> *)(ppRVar6 + sVar1);
    in_stack_fffffffffffffbd8 = pSVar10;
    do {
      pRVar2 = *ppRVar6;
      if ((pRVar2->super_SyntaxNode).kind == StandardRsCaseItem) {
        pSVar10 = in_stack_fffffffffffffbd8;
        createProdItem((ProdItem *)local_1c8,*(RsProdItemSyntax **)&pRVar2[4].super_SyntaxNode,
                       context);
        uVar8 = *(long *)&pRVar2[3].super_SyntaxNode + 1;
        in_stack_fffffffffffffbd8 = pSVar10;
        if (1 < uVar8) {
          uVar8 = uVar8 >> 1;
          lVar9 = 0;
          do {
            ppSVar4 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                  *)((long)&(pRVar2[2].super_SyntaxNode.previewNode)->kind + lVar9))
            ;
            local_3e0 = *ppSVar4;
            SmallVectorBase<slang::syntax::ExpressionSyntax_const*>::
            emplace_back<slang::syntax::ExpressionSyntax_const*const&>
                      ((SmallVectorBase<slang::syntax::ExpressionSyntax_const*> *)&local_350,
                       (ExpressionSyntax **)&local_3e0);
            SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem>::
            emplace_back<slang::ast::RandSeqProductionSymbol::ProdItem_const&>
                      (local_2e0,(ProdItem *)local_1c8);
            lVar9 = lVar9 + 0x30;
            uVar8 = uVar8 - 1;
            in_stack_fffffffffffffbd8 = pSVar10;
          } while (uVar8 != 0);
        }
      }
      else if (local_3e8 == '\0') {
        createProdItem((ProdItem *)local_1c8,(RsProdItemSyntax *)pRVar2[2].super_SyntaxNode.parent,
                       context);
        local_408._0_8_ = local_1c8._0_8_;
        local_408._M_value.target = (RandSeqProductionSymbol *)local_1c8._8_8_;
        local_408._M_value.args._M_ptr = (pointer)local_1c8._16_8_;
        local_408._M_value.args._M_extent._M_extent_value =
             (__extent_storage<18446744073709551615UL>)
             (__extent_storage<18446744073709551615UL>)aCStack_1b0[0].expressions._M_ptr;
        if (local_3e8 == '\0') {
          local_3e8 = '\x01';
        }
      }
      ppRVar6 = ppRVar6 + 1;
    } while ((SmallVectorBase<const_slang::ast::Expression_*> *)ppRVar6 != pSVar10);
  }
  local_3e0 = &local_3c8;
  local_3d8 = 0;
  local_3d0 = 5;
  local_3a0 = local_350;
  ppEStack_398 = ppEStack_348;
  expressions_00._M_extent._M_extent_value = (size_t)&local_3e0;
  expressions_00._M_ptr = ppEStack_348;
  Expression::bindMembershipExpressions
            ((Expression *)context,(ASTContext *)0x73,Unknown,false,true,true,
             SUB81((syntax->expr).ptr,0),local_350,expressions_00,in_stack_fffffffffffffbd8);
  local_1c8._0_8_ = aCStack_1b0;
  local_1c8._8_8_ = (RandSeqProductionSymbol *)0x0;
  local_1c8._16_8_ = (pointer)0x8;
  local_390[0].data_ = (pointer)local_390[0].firstElement;
  local_390[0].cap = 5;
  this = ((context->scope).ptr)->compilation;
  args = *(Expression **)&local_3e0->kind;
  sVar1 = (syntax->items).super_span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  src = extraout_RDX;
  if (sVar1 != 0) {
    ppRVar11 = (syntax->items).super_span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>
               ._M_ptr;
    ppRVar6 = ppRVar11 + sVar1;
    args_00 = &local_3e0->parent;
    pPVar7 = local_2e0[0].data_;
    do {
      local_390[0].len = 0;
      pRVar2 = *ppRVar11;
      if ((pRVar2->super_SyntaxNode).kind == StandardRsCaseItem) {
        if (1 < *(long *)&pRVar2[3].super_SyntaxNode + 1U) {
          uVar8 = 0;
          do {
            SmallVectorBase<slang::ast::Expression_const*>::
            emplace_back<slang::ast::Expression_const*const&>
                      ((SmallVectorBase<slang::ast::Expression_const*> *)local_390,
                       (Expression **)args_00);
            args_00 = args_00 + 1;
            uVar8 = uVar8 + 1;
            src = extraout_RDX_00;
          } while (uVar8 < *(long *)&pRVar2[3].super_SyntaxNode + 1U >> 1);
        }
        iVar3 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                          (local_390,(EVP_PKEY_CTX *)this,src);
        local_310.expressions._M_ptr = (pointer)CONCAT44(extraout_var,iVar3);
        local_310.item.super_ProdBase.kind = (pPVar7->super_ProdBase).kind;
        local_310.item._4_4_ = *(undefined4 *)&pPVar7->field_0x4;
        local_310.item.target = pPVar7->target;
        local_310.item.args._M_ptr = (pPVar7->args)._M_ptr;
        local_310.item.args._M_extent._M_extent_value = (pPVar7->args)._M_extent._M_extent_value;
        SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>::
        emplace_back<slang::ast::RandSeqProductionSymbol::CaseItem>
                  ((SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem> *)local_1c8,
                   &local_310);
        pPVar7 = pPVar7 + 1;
        src = extraout_RDX_01;
      }
      ppRVar11 = ppRVar11 + 1;
    } while (ppRVar11 != ppRVar6);
  }
  local_390[0].len = 0;
  iVar3 = SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>::copy
                    ((SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem> *)local_1c8,
                     (EVP_PKEY_CTX *)this,src);
  local_310.expressions._M_ptr = (pointer)CONCAT44(extraout_var_00,iVar3);
  pCVar5 = BumpAllocator::
           emplace<slang::ast::RandSeqProductionSymbol::CaseProd,slang::ast::Expression_const&,std::span<slang::ast::RandSeqProductionSymbol::CaseItem,18446744073709551615ul>,std::optional<slang::ast::RandSeqProductionSymbol::ProdItem>&>
                     (&this->super_BumpAllocator,args,
                      (span<slang::ast::RandSeqProductionSymbol::CaseItem,_18446744073709551615UL> *
                      )&local_310,
                      (optional<slang::ast::RandSeqProductionSymbol::ProdItem> *)&local_408._M_value
                     );
  if (local_390[0].data_ != (pointer)local_390[0].firstElement) {
    operator_delete(local_390[0].data_);
  }
  if ((CaseItem *)local_1c8._0_8_ != aCStack_1b0) {
    operator_delete((void *)local_1c8._0_8_);
  }
  if (local_3e0 != &local_3c8) {
    operator_delete(local_3e0);
  }
  if (local_2e0[0].data_ != (pointer)local_2e0[0].firstElement) {
    operator_delete(local_2e0[0].data_);
  }
  if (local_350 != &local_338) {
    operator_delete(local_350);
  }
  return pCVar5;
}

Assistant:

const RandSeqProductionSymbol::CaseProd& RandSeqProductionSymbol::createCaseProd(
    const RsCaseSyntax& syntax, const ASTContext& context) {

    SmallVector<const ExpressionSyntax*> expressions;
    SmallVector<ProdItem, 8> prods;
    std::optional<ProdItem> defItem;

    for (auto item : syntax.items) {
        switch (item->kind) {
            case SyntaxKind::StandardRsCaseItem: {
                auto& sci = item->as<StandardRsCaseItemSyntax>();
                auto pi = createProdItem(*sci.item, context);
                for (auto es : sci.expressions) {
                    expressions.push_back(es);
                    prods.push_back(pi);
                }
                break;
            }
            case SyntaxKind::DefaultRsCaseItem:
                // The parser already errored for duplicate defaults,
                // so just ignore if it happens here.
                if (!defItem)
                    defItem = createProdItem(*item->as<DefaultRsCaseItemSyntax>().item, context);
                break;
            default:
                SLANG_UNREACHABLE;
        }
    }

    SmallVector<const Expression*> bound;
    Expression::bindMembershipExpressions(context, TokenKind::CaseKeyword,
                                          /* requireIntegral */ false,
                                          /* unwrapUnpacked */ false,
                                          /* allowTypeReferences */ true,
                                          /* allowValueRange */ true, *syntax.expr, expressions,
                                          bound);

    SmallVector<CaseItem, 8> items;
    SmallVector<const Expression*> group;
    auto& comp = context.getCompilation();
    auto boundIt = bound.begin();
    auto prodIt = prods.begin();
    auto expr = *boundIt++;

    for (auto item : syntax.items) {
        switch (item->kind) {
            case SyntaxKind::StandardRsCaseItem: {
                auto& sci = item->as<StandardRsCaseItemSyntax>();
                for (size_t i = 0; i < sci.expressions.size(); i++)
                    group.push_back(*boundIt++);

                items.push_back({group.copy(comp), *prodIt++});
                group.clear();
                break;
            }
            default:
                break;
        }
    }

    return *comp.emplace<CaseProd>(*expr, items.copy(comp), defItem);
}